

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_mthd.c
# Opt level: O1

void decode_nvrm_mthd_device_unk1102(nvrm_mthd_device_unk1102 *m,mmt_memory_dump *args,int argc)

{
  int iVar1;
  mmt_buf *buf;
  
  if (m->cnt == 0) {
    iVar1 = _nvrm_field_enabled("cnt");
    if (iVar1 != 0) goto LAB_0025ad97;
  }
  else {
LAB_0025ad97:
    fprintf(_stdout,"%scnt: 0x%08x",nvrm_pfx,(ulong)m->cnt);
  }
  nvrm_pfx = nvrm_sep;
  if (m->unk04 == 0) {
    iVar1 = _nvrm_field_enabled("unk04");
    if (iVar1 != 0) goto LAB_0025ade9;
  }
  else {
LAB_0025ade9:
    fprintf(_stdout,"%sunk04: 0x%08x",nvrm_pfx,(ulong)m->unk04);
  }
  nvrm_pfx = nvrm_sep;
  if (m->ptr == 0) {
    iVar1 = _nvrm_field_enabled("ptr");
    if (iVar1 != 0) goto LAB_0025ae28;
  }
  else {
LAB_0025ae28:
    if (m->ptr == 0) {
      buf = (mmt_buf *)0x0;
      fprintf(_stdout,"%sptr: %s",nvrm_pfx,"NULL");
      goto LAB_0025aea0;
    }
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr: 0x%016lx",nvrm_pfx);
    if (0 < argc) {
      buf = find_ptr(m->ptr,args,argc);
    }
    if (buf != (mmt_buf *)0x0) goto LAB_0025aea0;
    fputs(" [no data]",_stdout);
  }
  buf = (mmt_buf *)0x0;
LAB_0025aea0:
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words(buf);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_mthd_device_unk1102(struct nvrm_mthd_device_unk1102 *m,
		struct mmt_memory_dump *args, int argc)
{
	nvrm_print_x32(m, cnt);
	nvrm_print_x32(m, unk04);
	struct mmt_buf *data = nvrm_print_ptr(m, ptr, args, argc);
	nvrm_print_ln();

	if (data)
		dump_mmt_buf_as_words(data);
}